

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O0

void __thiscall
ParserTransform_parseNamedModelCellml10_Test::~ParserTransform_parseNamedModelCellml10_Test
          (ParserTransform_parseNamedModelCellml10_Test *this)

{
  ParserTransform_parseNamedModelCellml10_Test *this_local;
  
  ~ParserTransform_parseNamedModelCellml10_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, parseNamedModelCellml10)
{
    const std::string n = "name";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/1.0#\" name=\"name\"/>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(n, model->name());
}